

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  Token closeBrace_00;
  Token openBrace_00;
  ConstraintBlockSyntax *pCVar1;
  SyntaxList<slang::syntax::ConstraintItemSyntax> *in_RDI;
  span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL> sVar2;
  span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL> members;
  Token openBrace;
  Token closeBrace;
  anon_class_16_2_19c40af4 *in_stack_00000120;
  SyntaxKind in_stack_0000012c;
  Token *in_stack_00000130;
  TokenKind in_stack_0000013e;
  Parser *in_stack_00000140;
  Token *in_stack_ffffffffffffff40;
  SyntaxList<slang::syntax::ConstraintItemSyntax> *this_00;
  pointer in_stack_ffffffffffffff48;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff50;
  __extent_storage<18446744073709551615UL> _Var3;
  pointer local_40;
  ParserBase *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  Info *local_18;
  
  Token::Token(in_stack_ffffffffffffff40);
  ParserBase::expect(in_stack_ffffffffffffffd0,local_40._14_2_);
  sVar2 = parseMemberList<slang::syntax::ConstraintItemSyntax,slang::parsing::Parser::parseConstraintBlock(bool)::__0>
                    (in_stack_00000140,in_stack_0000013e,in_stack_00000130,in_stack_0000012c,
                     in_stack_00000120);
  this_00 = in_RDI + 4;
  local_40 = sVar2._M_ptr;
  _Var3 = sVar2._M_extent._M_extent_value;
  sVar2._M_extent._M_extent_value = in_stack_ffffffffffffff50._M_extent_value;
  sVar2._M_ptr = in_stack_ffffffffffffff48;
  slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>::SyntaxList(this_00,sVar2);
  openBrace_00.info = (Info *)_Var3._M_extent_value;
  openBrace_00._0_8_ = local_40;
  closeBrace_00.info = local_18;
  closeBrace_00._0_8_ = local_20;
  pCVar1 = slang::syntax::SyntaxFactory::constraintBlock
                     ((SyntaxFactory *)this_00,openBrace_00,in_RDI,closeBrace_00);
  return pCVar1;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}